

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_misc_tests.cpp
# Opt level: O3

void __thiscall
iu_UnitAnyTest_x_iutest_x_String_Test::Body(iu_UnitAnyTest_x_iutest_x_String_Test *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined8 *puVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  any a;
  AssertionResult iutest_ar;
  allocator<char> local_1f9;
  any local_1f8;
  AssertionResult local_1f0;
  AssertionHelper local_1c8;
  undefined1 local_198 [392];
  
  iutest::any::any(&local_1f8,"test");
  if (local_1f8.content != (placeholder *)0x0) {
    iVar1 = (*(local_1f8.content)->_vptr_placeholder[2])();
    if ((undefined1 *)CONCAT44(extraout_var,iVar1) ==
        &iutest::internal::helper::TestTypeIdHelper<std::__cxx11::string>::_dummy) {
      local_198._0_8_ = local_198 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_198,local_1f8.content[1]._vptr_placeholder,
                 (long)local_1f8.content[2]._vptr_placeholder +
                 (long)local_1f8.content[1]._vptr_placeholder);
      iutest::internal::CmpHelperEQ<char[5],std::__cxx11::string>
                (&local_1f0,(internal *)"\"test\"","::iutest::any_cast< ::std::string >(a)","test",
                 (char (*) [5])local_198,in_R9);
      if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
        operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
      }
      if (local_1f0.m_result == false) {
        memset((iu_global_format_stringstream *)local_198,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_198);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1c8,local_1f0.m_message._M_dataplus._M_p,&local_1f9);
        local_1c8.m_part_result.super_iuCodeMessage.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_misc_tests.cpp"
        ;
        local_1c8.m_part_result.super_iuCodeMessage.m_line = 0x34;
        local_1c8.m_part_result.super_iuCodeMessage._44_4_ = 1;
        iutest::AssertionHelper::OnFixed(&local_1c8,(Fixed *)local_198,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
            &local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2) {
          operator_delete(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                          local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                          _M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
        std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0.m_message._M_dataplus._M_p != &local_1f0.m_message.field_2) {
        operator_delete(local_1f0.m_message._M_dataplus._M_p,
                        local_1f0.m_message.field_2._M_allocated_capacity + 1);
      }
      if (local_1f8.content != (placeholder *)0x0) {
        (*(local_1f8.content)->_vptr_placeholder[1])();
      }
      return;
    }
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__bad_cast_00185390;
  __cxa_throw(puVar2,&iutest::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

IUTEST(UnitAnyTest, String)
{
    ::iutest::any a = "test";
    IUTEST_EXPECT_EQ("test", ::iutest::any_cast< ::std::string >(a));
}